

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MunitionDescriptor.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::MunitionDescriptor::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,MunitionDescriptor *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Descriptor:");
  poVar1 = std::operator<<(poVar1,"\n\tType:     ");
  EntityType::GetAsString_abi_cxx11_(&local_1c0,&(this->super_Descriptor).m_Type);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tWarhead:  ");
  ENUMS::GetEnumAsStringWarheadType_abi_cxx11_(&local_1e0,(ENUMS *)(ulong)this->m_ui16Warhead,Value)
  ;
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\n\tFuse:     ");
  ENUMS::GetEnumAsStringFuseType_abi_cxx11_(&local_200,(ENUMS *)(ulong)this->m_ui16Fuse,Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"\n\tQuantity: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Quantity);
  poVar1 = std::operator<<(poVar1,"\n\tRate:     ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Rate);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString MunitionDescriptor::GetAsString() const
{
    KStringStream ss;

    ss << "Descriptor:"
       << "\n\tType:     " << m_Type.GetAsString()
       << "\tWarhead:  "   << GetEnumAsStringWarheadType( m_ui16Warhead )
       << "\n\tFuse:     " << GetEnumAsStringFuseType( m_ui16Fuse )
       << "\n\tQuantity: " << m_ui16Quantity
       << "\n\tRate:     " << m_ui16Rate
       << "\n";

    return ss.str();
}